

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O2

void __thiscall Iir::Biquad::setOnePole(Biquad *this,complex_t pole,complex_t zero)

{
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM3_Qa;
  
  if (((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) != 0.0) ||
     (NAN((double)CONCAT44(in_XMM1_Db,in_XMM1_Da)))) {
    throw_invalid_argument("Imaginary part of pole is non-zero.");
  }
  if ((in_XMM3_Qa != 0.0) || (NAN(in_XMM3_Qa))) {
    throw_invalid_argument("Imaginary part of zero is non-zero.");
  }
  setCoefficients(this,1.0,-(double)CONCAT44(in_XMM0_Db,in_XMM0_Da),0.0,1.0,
                  -(double)CONCAT44(in_XMM2_Db,in_XMM2_Da),0.0);
  return;
}

Assistant:

void Biquad::setOnePole (complex_t pole, complex_t zero)
	{
		if (pole.imag() != 0) throw_invalid_argument("Imaginary part of pole is non-zero.");
		if (zero.imag() != 0) throw_invalid_argument("Imaginary part of zero is non-zero.");

		const double a0 = 1;
		const double a1 = -pole.real();
		const double a2 = 0;
		const double b0 = 1;
		const double b1 = -zero.real();
		const double b2 = 0;

		setCoefficients (a0, a1, a2, b0, b1, b2);
	}